

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O1

slab * slab_get(slab_cache *cache,size_t size)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  byte order;
  uint uVar4;
  slab *psVar5;
  size_t sVar6;
  
  uVar1 = size + 0x30;
  if (cache->order0_size < uVar1) {
    if (cache->arena->slab_size < uVar1) {
      order = cache->order_max + 1;
    }
    else {
      uVar4 = (int)uVar1 - 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      order = 0x20 - (((byte)iVar3 ^ 0x1f) + cache->order0_size_lb);
    }
  }
  else {
    order = 0;
  }
  if (cache->order_max + 1 == (uint)order) {
    psVar5 = slab_get_large(cache,size);
  }
  else {
    psVar5 = slab_get_with_order(cache,order);
  }
  if (psVar5 != (slab *)0x0) {
    sVar2 = psVar5->size;
    sVar6 = slab_real_size(cache,size);
    if (sVar2 != sVar6) {
      __assert_fail("slab == NULL || slab->size == slab_real_size(cache, size)",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                    ,0x145,"struct slab *slab_get(struct slab_cache *, size_t)");
    }
  }
  return psVar5;
}

Assistant:

struct slab *
slab_get(struct slab_cache *cache, size_t size)
{
	struct slab *slab;
	uint8_t order = slab_order(cache, size + slab_sizeof());
	if (order == cache->order_max + 1)
		slab = slab_get_large(cache, size);
	else
		slab = slab_get_with_order(cache, order);
	assert(slab == NULL || slab->size == slab_real_size(cache, size));
	return slab;
}